

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void av1_get_second_pass_params(AV1_COMP *cpi,EncodeFrameParams *frame_params,uint frame_flags)

{
  double *pdVar1;
  FIRSTPASS_INFO *firstpass_info;
  int64_t *piVar2;
  GF_GROUP *gf_group;
  FRAME_UPDATE_TYPE FVar3;
  byte bVar4;
  aom_enc_pass aVar5;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  lookahead_ctx *lookahead;
  STATS_BUFFER_CTX *pSVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  FIRSTPASS_STATS *pFVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  FIRSTPASS_STATS *pFVar17;
  long lVar18;
  int *piVar19;
  FIRSTPASS_STATS *pFVar20;
  AV1_PRIMARY *pAVar21;
  long lVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double zero_motion_accumulator;
  FIRSTPASS_STATS this_frame;
  FIRSTPASS_STATS this_frame_copy;
  double local_248;
  undefined4 local_23c;
  FIRSTPASS_STATS *local_238;
  EncodeFrameParams *local_230;
  AV1_PRIMARY *local_228;
  FIRSTPASS_STATS *local_220;
  double local_218;
  double local_210;
  double local_208;
  FIRSTPASS_STATS local_200;
  undefined1 local_118 [232];
  
  pAVar21 = cpi->ppi;
  gf_group = &pAVar21->gf_group;
  if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.gop_mode == '\x01')) {
    uVar11 = (ulong)cpi->gf_frame_index;
    frame_params->frame_type = (pAVar21->gf_group).frame_type[uVar11];
    FVar3 = (pAVar21->gf_group).update_type[uVar11];
    frame_params->show_frame = (uint)(FVar3 != '\x06' && FVar3 != '\x03');
    if (uVar11 != 0) {
      return;
    }
    av1_tf_info_reset(&pAVar21->tf_info);
    av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
    return;
  }
  pFVar12 = (cpi->twopass_frame).stats_in;
  aVar5 = (cpi->oxcf).pass;
  bVar23 = true;
  if (aVar5 < AOM_RC_LAST_PASS) {
    if ((aVar5 == AOM_RC_ONE_PASS) && (cpi->compressor_stage == '\0')) {
      bVar23 = pAVar21->lap_enabled != 0;
    }
    else {
      bVar23 = false;
    }
  }
  if ((bool)(bVar23 & pFVar12 == (FIRSTPASS_STATS *)0x0)) {
    return;
  }
  iVar9 = is_forced_keyframe_pending
                    (pAVar21->lookahead,pAVar21->lookahead->max_sz,cpi->compressor_stage);
  if (iVar9 == 0) {
    (cpi->rc).frames_to_key = 0;
  }
  else if ((0 < iVar9) && (iVar9 < (cpi->rc).frames_to_key)) {
    (cpi->rc).frames_to_key = iVar9;
  }
  bVar4 = cpi->gf_frame_index;
  FVar3 = (pAVar21->gf_group).update_type[bVar4];
  frame_params->frame_type = (pAVar21->gf_group).frame_type[bVar4];
  if ((((frame_flags & 1) == 0) && ((int)(uint)bVar4 < (pAVar21->gf_group).size)) &&
     ((setup_target_rate(cpi), FVar3 == '\x06' || (FVar3 == '\x03')))) {
    pFVar12 = (cpi->twopass_frame).stats_in;
    if (pFVar12 == (FIRSTPASS_STATS *)0x0) {
      return;
    }
    pFVar12 = pFVar12 + (pAVar21->gf_group).arf_src_offset[cpi->gf_frame_index];
    if (((pAVar21->twopass).stats_buf_ctx)->stats_in_end <= pFVar12) {
      return;
    }
    dVar28 = log1p(pFVar12->intra_error);
    (cpi->twopass_frame).mb_av_energy = dVar28;
    pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
      dVar28 = log1p(pFVar12->frame_avg_wavelet_energy);
      (cpi->twopass_frame).frame_avg_haar_energy = dVar28;
    }
    if (pFVar12->intra_skip_pct < 0.15) {
      (cpi->twopass_frame).fr_content_type = '\0';
      return;
    }
    (cpi->twopass_frame).fr_content_type = '\x01';
    return;
  }
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
  }
  if (((((pAVar21->gf_group).size == (uint)cpi->gf_frame_index) && (cpi->ppi->lap_enabled != 0)) &&
      ((cpi->ppi->p_rc).enable_scenecut_detection != 0)) &&
     (iVar9 = define_kf_interval(cpi,&(pAVar21->twopass).firstpass_info,0x11,0), iVar9 != -1)) {
    iVar13 = (cpi->rc).frames_to_key;
    if (iVar13 < iVar9) {
      iVar9 = iVar13;
    }
    (cpi->rc).frames_to_key = iVar9;
  }
  memset(&local_200,0,0xe8);
  aVar5 = (cpi->oxcf).pass;
  if ((aVar5 < AOM_RC_LAST_PASS) &&
     (((aVar5 != AOM_RC_ONE_PASS || (cpi->compressor_stage != '\0')) || (cpi->ppi->lap_enabled == 0)
      ))) {
    iVar9 = (cpi->oxcf).rc_cfg.cq_level;
    (cpi->rc).active_worst_quality = iVar9;
    local_23c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
  }
  else if (((int)(uint)cpi->gf_frame_index < (pAVar21->gf_group).size) ||
          (local_23c = 1, (cpi->rc).frames_to_key == 0)) {
    process_first_pass_stats(cpi,&local_200);
    local_23c = 0;
  }
  memcpy(local_118,&local_200,0xe8);
  if ((cpi->rc).frames_to_key < 1) {
    frame_params->frame_type = '\0';
    pAVar6 = cpi->ppi;
    local_208 = local_200.coded_error;
    (cpi->rc).frames_since_key = 0;
    (pAVar6->p_rc).use_arf_in_this_kf_group =
         (uint)(byte)(2 < (cpi->oxcf).gf_cfg.lag_in_frames & (cpi->oxcf).gf_cfg.enable_auto_arf);
    memset(&pAVar6->gf_group,0,0x58f4);
    cpi->gf_frame_index = '\0';
    (cpi->rc).frames_till_gf_update_due = 0;
    if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
      lookahead = cpi->ppi->lookahead;
      iVar9 = is_forced_keyframe_pending(lookahead,lookahead->max_sz,cpi->compressor_stage);
      if ((cpi->common).current_frame.frame_number == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (uint)((cpi->rc).frames_to_key == 0);
      }
      (pAVar6->p_rc).this_key_frame_forced = uVar14;
      if (iVar9 == -1) {
        iVar13 = (cpi->oxcf).kf_cfg.key_freq_max;
        iVar9 = 1;
        if (1 < iVar13) {
          iVar9 = iVar13;
        }
      }
      (cpi->rc).frames_to_key = iVar9;
      correct_frames_to_key(cpi);
      (pAVar6->p_rc).kf_boost = 0x8fc;
      (pAVar6->gf_group).update_type[0] = '\0';
    }
    else {
      firstpass_info = &(pAVar6->twopass).firstpass_info;
      local_220 = (cpi->twopass_frame).stats_in;
      local_248 = 1.0;
      local_218 = 0.0;
      (pAVar6->p_rc).this_key_frame_forced = (pAVar6->p_rc).next_key_frame_forced;
      (pAVar6->twopass).kf_group_bits = 0;
      (pAVar6->twopass).kf_group_error_left = 0.0;
      local_230 = frame_params;
      local_210 = calculate_modified_err_new
                            (&cpi->frame_info,((pAVar6->twopass).stats_buf_ctx)->total_stats,
                             &local_200,(cpi->oxcf).rc_cfg.vbrbias,
                             (pAVar6->twopass).modified_error_min,
                             (pAVar6->twopass).modified_error_max);
      iVar10 = define_kf_interval(cpi,firstpass_info,(cpi->oxcf).kf_cfg.key_freq_max,1);
      iVar9 = (cpi->oxcf).kf_cfg.key_freq_max;
      iVar13 = iVar10;
      if (iVar9 < iVar10) {
        iVar13 = iVar9;
      }
      if (iVar10 == -1) {
        iVar13 = iVar9;
      }
      (cpi->rc).frames_to_key = iVar13;
      if (cpi->ppi->lap_enabled != 0) {
        correct_frames_to_key(cpi);
      }
      if (((cpi->oxcf).kf_cfg.auto_key == true) &&
         (iVar9 = (cpi->rc).frames_to_key, (cpi->oxcf).kf_cfg.key_freq_max < iVar9)) {
        iVar13 = iVar9 / 2;
        (cpi->rc).frames_to_key = iVar13;
        (cpi->twopass_frame).stats_in = local_220;
        uVar14 = 1;
        if (1 < iVar9) {
          pFVar7 = ((pAVar6->twopass).stats_buf_ctx)->stats_in_end;
          pFVar17 = local_220;
          do {
            if (pFVar7 <= pFVar17) break;
            pFVar17 = pFVar17 + 1;
            (cpi->twopass_frame).stats_in = pFVar17;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
      }
      else if (((cpi->twopass_frame).stats_in != ((pAVar6->twopass).stats_buf_ctx)->stats_in_end) ||
              (uVar14 = 1, (cpi->oxcf).pass < AOM_RC_LAST_PASS)) {
        uVar14 = (uint)((cpi->oxcf).kf_cfg.key_freq_max <= (cpi->rc).frames_to_key);
      }
      (pAVar6->p_rc).next_key_frame_forced = uVar14;
      iVar9 = (cpi->rc).frames_to_key;
      local_238 = pFVar12;
      local_228 = pAVar21;
      if (iVar9 < 1) {
        dVar28 = 0.0;
      }
      else {
        dVar28 = 0.0;
        iVar13 = 0;
        do {
          pFVar12 = av1_firstpass_info_peek(firstpass_info,iVar13);
          if (pFVar12 != (FIRSTPASS_STATS *)0x0) {
            dVar27 = calculate_modified_err_new
                               (&cpi->frame_info,&(pAVar6->twopass).firstpass_info.total_stats,
                                pFVar12,(cpi->oxcf).rc_cfg.vbrbias,
                                (pAVar6->twopass).modified_error_min,
                                (pAVar6->twopass).modified_error_max);
            dVar28 = dVar28 + dVar27;
            piVar19 = &(pAVar6->p_rc).num_stats_used_for_kf_boost;
            *piVar19 = *piVar19 + 1;
          }
          iVar13 = iVar13 + 1;
          iVar9 = (cpi->rc).frames_to_key;
        } while (iVar13 < iVar9);
      }
      pFVar12 = local_220;
      if (((0 < (pAVar6->twopass).bits_left) && (0.0 < (pAVar6->twopass).modified_error_left)) ||
         ((cpi->ppi->lap_enabled != 0 && ((cpi->oxcf).rc_cfg.mode != AOM_Q)))) {
        lVar18 = (long)(cpi->rc).avg_frame_bandwidth;
        lVar16 = (cpi->oxcf).rc_cfg.vbrmax_section * lVar18;
        if (lVar16 < -99) {
          lVar16 = 0;
        }
        else {
          lVar16 = lVar16 / 100;
          lVar22 = (long)(cpi->rc).max_frame_bandwidth;
          if (lVar22 <= lVar16) {
            lVar16 = lVar22;
          }
          lVar16 = (long)(int)lVar16;
        }
        uVar14 = (cpi->oxcf).rc_cfg.vbr_corpus_complexity_lap;
        if (uVar14 == 0) {
          dVar27 = 0.0;
        }
        else {
          (cpi->twopass_frame).stats_in = local_220;
          if (iVar9 < 1) {
            dVar27 = 0.0;
            iVar13 = 1;
          }
          else {
            pFVar7 = ((pAVar6->twopass).stats_buf_ctx)->stats_in_end;
            iVar10 = 0;
            dVar27 = 0.0;
            uVar24 = SUB84(local_208,0);
            uVar25 = (undefined4)((ulong)local_208 >> 0x20);
            pFVar17 = local_220;
            dVar26 = local_208;
            do {
              pFVar20 = pFVar17;
              if (pFVar17 < pFVar7) {
                uVar24 = SUB84(pFVar17->coded_error,0);
                uVar25 = (undefined4)((ulong)pFVar17->coded_error >> 0x20);
                pFVar20 = pFVar17 + 1;
                (cpi->twopass_frame).stats_in = pFVar20;
              }
              dVar27 = dVar27 + dVar26;
              iVar13 = iVar10;
              if (pFVar7 <= pFVar17) break;
              iVar10 = iVar10 + 1;
              dVar26 = (double)CONCAT44(uVar25,uVar24);
              pFVar17 = pFVar20;
              iVar13 = iVar9;
            } while (iVar9 != iVar10);
            iVar13 = iVar13 + 1;
          }
          if (iVar9 <= iVar13) {
            iVar13 = iVar9;
          }
          dVar27 = dVar27 / (double)iVar13;
        }
        pAVar21 = cpi->ppi;
        if (pAVar21->lap_enabled == 0) {
          lVar18 = (long)((dVar28 / (pAVar21->twopass).modified_error_left) *
                         (double)(pAVar21->twopass).bits_left);
        }
        else {
          lVar18 = lVar18 * iVar9;
          if (uVar14 != 0) {
            lVar18 = (long)((double)lVar18 * (dVar27 / ((double)uVar14 / 10.0)));
          }
        }
        lVar16 = lVar16 * iVar9;
        if (lVar18 < lVar16) {
          lVar16 = lVar18;
        }
      }
      else {
        lVar16 = 0;
      }
      lVar22 = 0x7fffffffffffffff;
      lVar18 = 0;
      if (0 < lVar16) {
        lVar18 = lVar16;
      }
      (pAVar6->twopass).kf_group_bits = lVar18;
      if (cpi->ppi->lap_enabled == 0) {
        iVar9 = 0x7fffffff;
      }
      else {
        iVar9 = (int)(cpi->framerate * 5.0);
        iVar13 = (cpi->rc).frames_to_key;
        if (iVar9 < iVar13) {
          lVar22 = (long)(((double)iVar9 * (double)lVar18) / (double)iVar13);
        }
      }
      (cpi->twopass_frame).stats_in = local_220;
      dVar27 = get_kf_boost_score(cpi,local_200.intra_error,&local_248,&local_218,0);
      (cpi->twopass_frame).stats_in = pFVar12;
      (pAVar6->twopass).kf_zeromotion_pct = (int)(local_248 * 100.0);
      pFVar7 = ((pAVar6->twopass).stats_buf_ctx)->stats_in_end;
      iVar13 = (cpi->rc).frames_to_key;
      dVar29 = 0.0;
      dVar26 = 0.0;
      if (0 < iVar13 && pFVar12 < pFVar7) {
        iVar10 = 1;
        pFVar17 = pFVar12;
        dVar26 = 0.0;
        do {
          dVar29 = dVar29 + pFVar17->intra_error;
          dVar26 = dVar26 + pFVar17->coded_error;
          if (pFVar7 <= pFVar17 + 1) break;
          bVar23 = iVar10 < iVar13;
          iVar10 = iVar10 + 1;
          pFVar17 = pFVar17 + 1;
        } while (bVar23);
      }
      (pAVar6->twopass).section_intra_rating =
           (int)(dVar29 / (dVar26 + *(double *)(&DAT_004e4db0 + (ulong)(dVar26 < 0.0) * 8)));
      (pAVar6->p_rc).kf_boost = (int)dVar27;
      pAVar21 = cpi->ppi;
      if (pAVar21->lap_enabled != 0) {
        if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
          if ((pAVar21->p_rc).num_stats_used_for_kf_boost < iVar13) {
            dVar27 = (double)iVar13;
            if (dVar27 < 0.0) {
              dVar27 = sqrt(dVar27);
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            if (10.0 <= dVar27) {
              dVar27 = 10.0;
            }
            if (dVar27 <= 4.0) {
              dVar27 = 4.0;
            }
            dVar26 = (double)(cpi->ppi->p_rc).num_stats_used_for_kf_boost;
            if (dVar26 < 0.0) {
              dVar26 = sqrt(dVar26);
            }
            else {
              dVar26 = SQRT(dVar26);
            }
            if (10.0 <= dVar26) {
              dVar26 = 10.0;
            }
            if (dVar26 <= 4.0) {
              dVar26 = 4.0;
            }
            dVar27 = rint(((dVar27 * 14.0 + 75.0) * (double)(cpi->ppi->p_rc).kf_boost) /
                          (dVar26 * 14.0 + 75.0));
            iVar13 = (int)dVar27;
          }
          else {
            iVar13 = (pAVar21->p_rc).kf_boost;
          }
        }
        else {
          dVar27 = get_kf_boost_score(cpi,local_200.intra_error,&local_248,&local_218,1);
          (cpi->twopass_frame).stats_in = pFVar12;
          iVar13 = (int)dVar27 + (pAVar6->p_rc).kf_boost;
        }
        (pAVar6->p_rc).kf_boost = iVar13;
      }
      if ((local_248 <= 0.99) || ((cpi->rc).frames_to_key < 9)) {
        iVar13 = (pAVar6->p_rc).kf_boost;
        iVar10 = (cpi->rc).frames_to_key;
        iVar15 = iVar10 * 3;
        if (iVar13 != iVar15 && SBORROW4(iVar13,iVar15) == iVar13 + iVar10 * -3 < 0) {
          iVar15 = iVar13;
        }
        (pAVar6->p_rc).kf_boost = iVar15;
        iVar13 = 600;
        if (600 < iVar15) {
          iVar13 = iVar15;
        }
      }
      else {
        iVar10 = (pAVar6->p_rc).kf_boost;
        iVar13 = 0x1518;
        if (0x1518 < iVar10) {
          iVar13 = iVar10;
        }
      }
      (pAVar6->p_rc).kf_boost = iVar13;
      iVar10 = (cpi->rc).frames_to_key;
      if (iVar10 < iVar9) {
        iVar9 = iVar10;
      }
      lVar16 = (pAVar6->twopass).kf_group_bits;
      if (lVar16 < lVar22) {
        lVar22 = lVar16;
      }
      iVar9 = calculate_boost_bits(iVar9 + -1,iVar13,lVar22);
      iVar9 = adjust_boost_bits_for_target_level(cpi,&cpi->rc,iVar9,lVar16,0);
      piVar2 = &(pAVar6->twopass).kf_group_bits;
      *piVar2 = *piVar2 - (long)iVar9;
      (pAVar6->gf_group).bit_allocation[0] = iVar9;
      (pAVar6->gf_group).update_type[0] = '\0';
      if (cpi->ppi->lap_enabled == 0) {
        dVar27 = dVar28 - local_210;
      }
      else {
        dVar27 = (double)((cpi->rc).frames_to_key + -1);
      }
      (pAVar6->twopass).kf_group_error_left = dVar27;
      (pAVar6->twopass).modified_error_left = (pAVar6->twopass).modified_error_left - dVar28;
      pAVar21 = local_228;
      frame_params = local_230;
      pFVar12 = local_238;
    }
    memcpy(&local_200,local_118,0xe8);
  }
  if ((cpi->rc).frames_to_fwd_kf < 1) {
    (cpi->rc).frames_to_fwd_kf = (cpi->oxcf).kf_cfg.fwd_kf_dist;
  }
  if ((pAVar21->gf_group).size != (uint)cpi->gf_frame_index) goto LAB_00202b95;
  av1_tf_info_reset(&cpi->ppi->tf_info);
  iVar9 = (cpi->oxcf).gf_cfg.lag_in_frames;
  iVar13 = 0x10;
  if (0x1f < iVar9) {
    iVar10 = iVar9 - (cpi->oxcf).algo_cfg.arnr_max_frames / 2;
    iVar13 = 0x20;
    if (iVar10 < 0x20) {
      iVar13 = iVar10;
    }
  }
  if ((0 < (cpi->oxcf).kf_cfg.fwd_kf_dist) &&
     (iVar10 = (cpi->rc).frames_to_fwd_kf + 1, iVar10 < iVar13)) {
    iVar13 = iVar10;
  }
  if (iVar9 == 0) {
    iVar13 = (cpi->rc).max_gf_interval;
  }
  iVar9 = (cpi->rc).frames_to_key;
  uVar14 = (cpi->rc).frames_since_key;
  if (iVar9 <= iVar13) {
    iVar13 = iVar9;
  }
  if ((uVar14 < 2) ||
     ((iVar10 = (pAVar21->p_rc).frames_till_regions_update - uVar14, iVar10 < iVar9 &&
      (iVar10 <= iVar13)))) {
    pSVar8 = (pAVar21->twopass).stats_buf_ctx;
    pFVar7 = pSVar8->stats_in_end;
    pFVar17 = (cpi->twopass_frame).stats_in;
    iVar10 = (int)((ulong)((long)pFVar7 - (long)pFVar17) >> 3) * 0x4f72c235 + (uint)(uVar14 == 0);
    if (iVar9 < iVar10) {
      iVar10 = iVar9;
    }
    if (0x95 < iVar10) {
      iVar10 = 0x96;
    }
    (pAVar21->p_rc).frames_till_regions_update = iVar10;
    if (cpi->ppi->lap_enabled == 0) {
      pFVar17 = pFVar17 + -(ulong)(uVar14 == 0);
      uVar14 = 0;
    }
    else {
      pFVar20 = pSVar8->stats_in_start;
      for (pFVar17 = pFVar20; pFVar17 < pFVar7 + -1; pFVar17 = pFVar17 + 1) {
        pFVar17->is_flash =
             (ulong)(-(uint)(0.5 <= pFVar17[1].pcnt_second_ref &&
                            pFVar17[1].pcnt_inter < pFVar17[1].pcnt_second_ref) & 1);
      }
      if (pFVar20 <= pFVar7 + -1) {
        pFVar7[-1].is_flash = 0;
      }
      estimate_noise(pFVar20,pFVar7,(cpi->common).error);
      pSVar8 = (pAVar21->twopass).stats_buf_ctx;
      estimate_coeff(pSVar8->stats_in_start,pSVar8->stats_in_end);
      pFVar17 = (cpi->twopass_frame).stats_in;
      uVar14 = (uint)((cpi->rc).frames_since_key == 0);
    }
    iVar9 = identify_regions(pFVar17,iVar10,uVar14,(pAVar21->p_rc).regions,
                             &(pAVar21->p_rc).num_regions);
    if (iVar9 == -1) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Error allocating buffers in identify_regions");
    }
  }
  lVar16 = (long)(pAVar21->p_rc).num_regions;
  iVar9 = (cpi->rc).frames_since_key;
  uVar14 = 0xffffffff;
  if (0 < lVar16) {
    iVar10 = iVar9 - (pAVar21->p_rc).regions_offset;
    piVar19 = &(pAVar21->p_rc).regions[0].last;
    lVar18 = 0;
    do {
      if ((((REGIONS *)(piVar19 + -1))->start <= iVar10) && (iVar10 <= *piVar19)) {
        uVar14 = (uint)lVar18;
        break;
      }
      lVar18 = lVar18 + 1;
      piVar19 = piVar19 + 0xe;
    } while (lVar16 != lVar18);
  }
  if ((int)uVar14 < 0) {
    if (iVar9 == 0) goto LAB_0020293a;
  }
  else if (iVar9 == 0 || (pAVar21->p_rc).regions[uVar14].type == SCENECUT_REGION) {
LAB_0020293a:
    (cpi->ppi->gf_state).arf_gf_boost_lst = 0;
  }
  calculate_gf_length(cpi,iVar13,0xf);
  if ((((0x10 < iVar13) && ((cpi->oxcf).algo_cfg.enable_tpl_model == true)) &&
      (0x1f < (cpi->oxcf).gf_cfg.lag_in_frames)) &&
     ((cpi->sf).tpl_sf.gop_length_decision_method != 3)) {
    iVar9 = (pAVar21->p_rc).gf_intervals[(pAVar21->p_rc).cur_gf_index];
    iVar15 = ((cpi->rc).frames_since_key + iVar9) - (pAVar21->p_rc).regions_offset;
    iVar13 = (pAVar21->p_rc).num_regions;
    lVar18 = (long)iVar13;
    iVar10 = -1;
    lVar16 = 0xffffffff;
    if (0 < lVar18) {
      piVar19 = &(pAVar21->p_rc).regions[0].last;
      lVar16 = 0;
      do {
        if ((((REGIONS *)(piVar19 + -1))->start < iVar15) && (iVar15 + -1 <= *piVar19))
        goto LAB_002029e6;
        lVar16 = lVar16 + 1;
        piVar19 = piVar19 + 0xe;
      } while (lVar18 != lVar16);
      lVar16 = 0xffffffff;
    }
LAB_002029e6:
    if (0 < iVar13) {
      piVar19 = &(pAVar21->p_rc).regions[0].last;
      lVar22 = 0;
      do {
        if ((((REGIONS *)(piVar19 + -1))->start <= iVar15) && (iVar15 <= *piVar19)) {
          iVar10 = (int)lVar22;
          break;
        }
        lVar22 = lVar22 + 1;
        piVar19 = piVar19 + 0xe;
      } while (lVar18 != lVar22);
    }
    bVar23 = true;
    if ((iVar9 < (cpi->rc).frames_to_key) &&
       (((int)lVar16 == -1 || ((pAVar21->p_rc).regions[(int)lVar16].type != SCENECUT_REGION)))) {
      if (iVar10 == -1) {
        bVar23 = false;
      }
      else {
        bVar23 = (pAVar21->p_rc).regions[iVar10].type == SCENECUT_REGION;
      }
    }
    if ((0x10 < iVar9) && ((cpi->rc).min_gf_interval < 0x11)) {
      define_gf_group(cpi,frame_params,0);
      av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
      memcpy(&local_200,local_118,0xe8);
      iVar13 = is_shorter_gf_interval_better(cpi,frame_params);
      if ((iVar13 != 0) &&
         ((calculate_gf_length(cpi,0x10,1), bVar23 &&
          (iVar13 = (pAVar21->p_rc).cur_gf_index, iVar9 - (pAVar21->p_rc).gf_intervals[iVar13] < 4))
         )) {
        (pAVar21->p_rc).gf_intervals[iVar13] = iVar9;
      }
    }
  }
  define_gf_group(cpi,frame_params,0);
  if ((gf_group->update_type[cpi->gf_frame_index] != '\x03') && (0 < (cpi->rc).frames_since_key)) {
    process_first_pass_stats(cpi,&local_200);
  }
  define_gf_group(cpi,frame_params,1);
  av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
  (cpi->rc).frames_till_gf_update_due = (pAVar21->p_rc).baseline_gf_interval;
LAB_00202b95:
  bVar4 = cpi->gf_frame_index;
  if ((gf_group->update_type[bVar4] == '\x06') || (gf_group->update_type[bVar4] == '\x03')) {
    (cpi->twopass_frame).stats_in = pFVar12;
    if ((pFVar12 != (FIRSTPASS_STATS *)0x0) &&
       (pFVar12 = pFVar12 + (pAVar21->gf_group).arf_src_offset[bVar4],
       pFVar12 < ((pAVar21->twopass).stats_buf_ctx)->stats_in_end)) {
      dVar28 = log1p(pFVar12->intra_error);
      (cpi->twopass_frame).mb_av_energy = dVar28;
      pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        dVar28 = log1p(pFVar12->frame_avg_wavelet_energy);
        (cpi->twopass_frame).frame_avg_haar_energy = dVar28;
      }
      if (0.15 <= pFVar12->intra_skip_pct) {
        (cpi->twopass_frame).fr_content_type = '\x01';
      }
      else {
        (cpi->twopass_frame).fr_content_type = '\0';
      }
    }
  }
  else {
    if ((char)local_23c != '\0') {
      pFVar12 = (FIRSTPASS_STATS *)0x0;
    }
    (cpi->twopass_frame).this_frame = pFVar12;
  }
  frame_params->frame_type = (pAVar21->gf_group).frame_type[cpi->gf_frame_index];
  setup_target_rate(cpi);
  return;
}

Assistant:

void av1_get_second_pass_params(AV1_COMP *cpi,
                                EncodeFrameParams *const frame_params,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
    frame_params->show_frame =
        !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
    if (cpi->gf_frame_index == 0) {
      av1_tf_info_reset(&cpi->ppi->tf_info);
      av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
    }
    return;
  }

  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  int update_total_stats = 0;

  if (is_stat_consumption_stage(cpi) && !cpi->twopass_frame.stats_in) return;

  // Check forced key frames.
  const int frames_to_next_forced_key = detect_app_forced_key(cpi);
  if (frames_to_next_forced_key == 0) {
    rc->frames_to_key = 0;
    frame_flags &= FRAMEFLAGS_KEY;
  } else if (frames_to_next_forced_key > 0 &&
             frames_to_next_forced_key < rc->frames_to_key) {
    rc->frames_to_key = frames_to_next_forced_key;
  }

  assert(cpi->twopass_frame.stats_in != NULL);
  const int update_type = gf_group->update_type[cpi->gf_frame_index];
  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];

  if (cpi->gf_frame_index < gf_group->size && !(frame_flags & FRAMEFLAGS_KEY)) {
    assert(cpi->gf_frame_index < gf_group->size);

    setup_target_rate(cpi);

    // If this is an arf frame then we dont want to read the stats file or
    // advance the input pointer as we already have what we need.
    if (update_type == ARF_UPDATE || update_type == INTNL_ARF_UPDATE) {
      const FIRSTPASS_STATS *const this_frame_ptr =
          read_frame_stats(twopass, &cpi->twopass_frame,
                           gf_group->arf_src_offset[cpi->gf_frame_index]);
      set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
      return;
    }
  }

  if (oxcf->rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;

  if (cpi->gf_frame_index == gf_group->size) {
    if (cpi->ppi->lap_enabled && cpi->ppi->p_rc.enable_scenecut_detection) {
      const int num_frames_to_detect_scenecut = MAX_GF_LENGTH_LAP + 1;
      const int frames_to_key = define_kf_interval(
          cpi, &twopass->firstpass_info, num_frames_to_detect_scenecut,
          /*search_start_idx=*/0);
      if (frames_to_key != -1)
        rc->frames_to_key = AOMMIN(rc->frames_to_key, frames_to_key);
    }
  }

  FIRSTPASS_STATS this_frame;
  av1_zero(this_frame);
  // call above fn
  if (is_stat_consumption_stage(cpi)) {
    if (cpi->gf_frame_index < gf_group->size || rc->frames_to_key == 0) {
      process_first_pass_stats(cpi, &this_frame);
      update_total_stats = 1;
    }
  } else {
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;
  }

  // Keyframe and section processing.
  FIRSTPASS_STATS this_frame_copy;
  this_frame_copy = this_frame;
  if (rc->frames_to_key <= 0) {
    assert(rc->frames_to_key == 0);
    // Define next KF group and assign bits to it.
    frame_params->frame_type = KEY_FRAME;
    find_next_key_frame(cpi, &this_frame);
    this_frame = this_frame_copy;
  }

  if (rc->frames_to_fwd_kf <= 0)
    rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  // Define a new GF/ARF group. (Should always enter here for key frames).
  if (cpi->gf_frame_index == gf_group->size) {
    av1_tf_info_reset(&cpi->ppi->tf_info);
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
    vbr_rc_reset_gop_data(&cpi->vbr_rc_info);
#endif  // CONFIG_BITRATE_ACCURACY
    int max_gop_length =
        (oxcf->gf_cfg.lag_in_frames >= 32)
            ? AOMMIN(MAX_GF_INTERVAL, oxcf->gf_cfg.lag_in_frames -
                                          oxcf->algo_cfg.arnr_max_frames / 2)
            : MAX_GF_LENGTH_LAP;

    // Handle forward key frame when enabled.
    if (oxcf->kf_cfg.fwd_kf_dist > 0)
      max_gop_length = AOMMIN(rc->frames_to_fwd_kf + 1, max_gop_length);

    // Use the provided gop size in low delay setting
    if (oxcf->gf_cfg.lag_in_frames == 0) max_gop_length = rc->max_gf_interval;

    // Limit the max gop length for the last gop in 1 pass setting.
    max_gop_length = AOMMIN(max_gop_length, rc->frames_to_key);

    // Identify regions if needed.
    // TODO(bohanli): identify regions for all stats available.
    if (rc->frames_since_key == 0 || rc->frames_since_key == 1 ||
        (p_rc->frames_till_regions_update - rc->frames_since_key <
             rc->frames_to_key &&
         p_rc->frames_till_regions_update - rc->frames_since_key <
             max_gop_length + 1)) {
      // how many frames we can analyze from this frame
      int rest_frames =
          AOMMIN(rc->frames_to_key, MAX_FIRSTPASS_ANALYSIS_FRAMES);
      rest_frames =
          AOMMIN(rest_frames, (int)(twopass->stats_buf_ctx->stats_in_end -
                                    cpi->twopass_frame.stats_in +
                                    (rc->frames_since_key == 0)));
      p_rc->frames_till_regions_update = rest_frames;

      int ret;
      if (cpi->ppi->lap_enabled) {
        mark_flashes(twopass->stats_buf_ctx->stats_in_start,
                     twopass->stats_buf_ctx->stats_in_end);
        estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
        estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end);
        ret = identify_regions(cpi->twopass_frame.stats_in, rest_frames,
                               (rc->frames_since_key == 0), p_rc->regions,
                               &p_rc->num_regions);
      } else {
        ret = identify_regions(
            cpi->twopass_frame.stats_in - (rc->frames_since_key == 0),
            rest_frames, 0, p_rc->regions, &p_rc->num_regions);
      }
      if (ret == -1) {
        aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in identify_regions");
      }
    }

    int cur_region_idx =
        find_regions_index(p_rc->regions, p_rc->num_regions,
                           rc->frames_since_key - p_rc->regions_offset);
    if ((cur_region_idx >= 0 &&
         p_rc->regions[cur_region_idx].type == SCENECUT_REGION) ||
        rc->frames_since_key == 0) {
      // If we start from a scenecut, then the last GOP's arf boost is not
      // needed for this GOP.
      cpi->ppi->gf_state.arf_gf_boost_lst = 0;
    }

    int need_gf_len = 1;
#if CONFIG_THREE_PASS
    if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
      // set up bitstream to read
      if (!cpi->third_pass_ctx->input_file_name && oxcf->two_pass_output) {
        cpi->third_pass_ctx->input_file_name = oxcf->two_pass_output;
      }
      av1_open_second_pass_log(cpi, 1);
      THIRD_PASS_GOP_INFO *gop_info = &cpi->third_pass_ctx->gop_info;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(cpi->second_pass_log_stream, gop_info,
                                    cpi->common.error);
#if CONFIG_BITRATE_ACCURACY
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cpi->common.error, tpl_info,
                          aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, cpi->second_pass_log_stream,
                        cpi->common.error);
      aom_free(tpl_info);
#if CONFIG_THREE_PASS
      // TODO(angiebird): Put this part into a func
      cpi->vbr_rc_info.cur_gop_idx++;
#endif  // CONFIG_THREE_PASS
#endif  // CONFIG_BITRATE_ACCURACY
      // Read in third_pass_info from the bitstream.
      av1_set_gop_third_pass(cpi->third_pass_ctx);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(
          cpi->second_pass_log_stream, cpi->third_pass_ctx->frame_info,
          gop_info->num_frames, cpi->common.error);

      p_rc->cur_gf_index = 0;
      p_rc->gf_intervals[0] = cpi->third_pass_ctx->gop_info.gf_length;
      need_gf_len = 0;
    }
#endif  // CONFIG_THREE_PASS

    if (need_gf_len) {
      // If we cannot obtain GF group length from second_pass_file
      // TODO(jingning): Resolve the redundant calls here.
      if (rc->intervals_till_gf_calculate_due == 0 || 1) {
        calculate_gf_length(cpi, max_gop_length, MAX_NUM_GF_INTERVALS);
      }

      if (max_gop_length > 16 && oxcf->algo_cfg.enable_tpl_model &&
          oxcf->gf_cfg.lag_in_frames >= 32 &&
          cpi->sf.tpl_sf.gop_length_decision_method != 3) {
        int this_idx = rc->frames_since_key +
                       p_rc->gf_intervals[p_rc->cur_gf_index] -
                       p_rc->regions_offset - 1;
        int this_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx);
        int next_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx + 1);
        // TODO(angiebird): Figure out why this_region and next_region are -1 in
        // unit test like AltRefFramePresenceTestLarge (aomedia:3134)
        int is_last_scenecut =
            p_rc->gf_intervals[p_rc->cur_gf_index] >= rc->frames_to_key ||
            (this_region != -1 &&
             p_rc->regions[this_region].type == SCENECUT_REGION) ||
            (next_region != -1 &&
             p_rc->regions[next_region].type == SCENECUT_REGION);

        int ori_gf_int = p_rc->gf_intervals[p_rc->cur_gf_index];

        if (p_rc->gf_intervals[p_rc->cur_gf_index] > 16 &&
            rc->min_gf_interval <= 16) {
          // The calculate_gf_length function is previously used with
          // max_gop_length = 32 with look-ahead gf intervals.
          define_gf_group(cpi, frame_params, 0);
          av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
          this_frame = this_frame_copy;

          if (is_shorter_gf_interval_better(cpi, frame_params)) {
            // A shorter gf interval is better.
            // TODO(jingning): Remove redundant computations here.
            max_gop_length = 16;
            calculate_gf_length(cpi, max_gop_length, 1);
            if (is_last_scenecut &&
                (ori_gf_int - p_rc->gf_intervals[p_rc->cur_gf_index] < 4)) {
              p_rc->gf_intervals[p_rc->cur_gf_index] = ori_gf_int;
            }
          }
        }
      }
    }

    define_gf_group(cpi, frame_params, 0);

    if (gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE &&
        rc->frames_since_key > 0)
      process_first_pass_stats(cpi, &this_frame);

    define_gf_group(cpi, frame_params, 1);

#if CONFIG_THREE_PASS
    // write gop info if needed for third pass. Per-frame info is written after
    // each frame is encoded.
    av1_write_second_pass_gop_info(cpi);
#endif  // CONFIG_THREE_PASS

    av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);

    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    assert(cpi->gf_frame_index == 0);
#if ARF_STATS_OUTPUT
    {
      FILE *fpfile;
      fpfile = fopen("arf.stt", "a");
      ++arf_count;
      fprintf(fpfile, "%10d %10d %10d %10d %10d\n",
              cpi->common.current_frame.frame_number,
              rc->frames_till_gf_update_due, cpi->ppi->p_rc.kf_boost, arf_count,
              p_rc->gfu_boost);

      fclose(fpfile);
    }
#endif
  }
  assert(cpi->gf_frame_index < gf_group->size);

  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
    reset_fpf_position(&cpi->twopass_frame, start_pos);

    const FIRSTPASS_STATS *const this_frame_ptr =
        read_frame_stats(twopass, &cpi->twopass_frame,
                         gf_group->arf_src_offset[cpi->gf_frame_index]);
    set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
  } else {
    // Back up this frame's stats for updating total stats during post encode.
    cpi->twopass_frame.this_frame = update_total_stats ? start_pos : NULL;
  }

  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
  setup_target_rate(cpi);
}